

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_significand<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,unsigned_int,fmt::v8::detail::digit_grouping<wchar_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,uint significand,
          int significand_size,int integral_size,wchar_t decimal_point,
          digit_grouping<wchar_t> *grouping)

{
  undefined2 uVar1;
  uint uVar2;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar3;
  uint uVar4;
  uint uVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  undefined1 uVar10;
  undefined1 auVar9 [16];
  format_decimal_result<wchar_t_*> fVar11;
  basic_string_view<wchar_t> digits;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> buffer;
  wchar_t wStack_858;
  wchar_t awStack_854 [11];
  undefined8 local_828;
  undefined1 *local_820;
  long local_818;
  long local_810;
  undefined1 local_808 [2016];
  
  if ((grouping->sep_).thousands_sep == L'\0') {
    if (decimal_point == L'\0') {
      fVar11 = format_decimal<wchar_t,unsigned_int>
                         ((wchar_t *)&local_828,significand,significand_size);
      pwVar6 = fVar11.end;
    }
    else {
      pwVar6 = (wchar_t *)((long)&local_828 + (long)significand_size * 4 + 4);
      uVar4 = significand_size - integral_size;
      pwVar7 = pwVar6;
      if (1 < (int)uVar4) {
        uVar5 = (uVar4 >> 1) + 1;
        pwVar8 = pwVar6;
        uVar2 = significand;
        do {
          pwVar7 = pwVar8 + -2;
          significand = uVar2 / 100;
          uVar1 = *(undefined2 *)
                   (
                   "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   + (ulong)(uVar2 % 100) * 2);
          uVar10 = (undefined1)((ushort)uVar1 >> 8);
          auVar9 = ZEXT416(CONCAT22((short)(CONCAT13(uVar10,CONCAT12(uVar10,uVar1)) >> 0x10),
                                    CONCAT11((char)uVar1,(char)uVar1)));
          auVar9 = pshuflw(auVar9,auVar9,0x60);
          *(ulong *)(pwVar8 + -2) = CONCAT44(auVar9._4_4_ >> 0x18,auVar9._0_4_ >> 0x18);
          uVar5 = uVar5 - 1;
          pwVar8 = pwVar7;
          uVar2 = uVar2 / 100;
        } while (1 < uVar5);
      }
      uVar2 = significand;
      if ((uVar4 & 1) != 0) {
        uVar2 = significand / 10;
        pwVar7[-1] = significand % 10 + L'0';
        pwVar7 = pwVar7 + -1;
      }
      pwVar7[-1] = decimal_point;
      format_decimal<wchar_t,unsigned_int>(pwVar7 + (-1 - (long)integral_size),uVar2,integral_size);
    }
    bVar3 = copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      ((wchar_t *)&local_828,pwVar6,out);
  }
  else {
    local_818 = 0;
    local_828 = &PTR_grow_001b39b0;
    local_810 = 500;
    local_820 = local_808;
    if (decimal_point == L'\0') {
      fVar11 = format_decimal<wchar_t,unsigned_int>(&wStack_858,significand,significand_size);
      pwVar6 = fVar11.end;
    }
    else {
      pwVar6 = awStack_854 + significand_size;
      uVar4 = significand_size - integral_size;
      pwVar7 = pwVar6;
      if (1 < (int)uVar4) {
        uVar5 = (uVar4 >> 1) + 1;
        pwVar8 = pwVar6;
        uVar2 = significand;
        do {
          pwVar7 = pwVar8 + -2;
          significand = uVar2 / 100;
          uVar1 = *(undefined2 *)
                   (
                   "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   + (ulong)(uVar2 % 100) * 2);
          uVar10 = (undefined1)((ushort)uVar1 >> 8);
          auVar9 = ZEXT416(CONCAT22((short)(CONCAT13(uVar10,CONCAT12(uVar10,uVar1)) >> 0x10),
                                    CONCAT11((char)uVar1,(char)uVar1)));
          auVar9 = pshuflw(auVar9,auVar9,0x60);
          *(ulong *)(pwVar8 + -2) = CONCAT44(auVar9._4_4_ >> 0x18,auVar9._0_4_ >> 0x18);
          uVar5 = uVar5 - 1;
          pwVar8 = pwVar7;
          uVar2 = uVar2 / 100;
        } while (1 < uVar5);
      }
      uVar2 = significand;
      if ((uVar4 & 1) != 0) {
        uVar2 = significand / 10;
        pwVar7[-1] = significand % 10 + L'0';
        pwVar7 = pwVar7 + -1;
      }
      pwVar7[-1] = decimal_point;
      format_decimal<wchar_t,unsigned_int>(pwVar7 + (-1 - (long)integral_size),uVar2,integral_size);
    }
    copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
              (&wStack_858,pwVar6,(buffer<wchar_t> *)&local_828);
    if (integral_size < 0) {
      fmt::v8::detail::assert_fail
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                 ,0x195,"negative value");
    }
    digits.size_._0_4_ = integral_size;
    digits.data_ = (wchar_t *)local_820;
    digits.size_._4_4_ = 0;
    digit_grouping<wchar_t>::
    apply<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t>(grouping,out,digits);
    bVar3 = copy_str_noinline<wchar_t,wchar_t*,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                      ((wchar_t *)(local_820 + (ulong)(uint)integral_size * 4),
                       (wchar_t *)(local_820 + local_818 * 4),out);
    if (local_820 != local_808) {
      operator_delete(local_820,local_810 << 2);
    }
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar3.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}